

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O3

size_t SSL_get_all_group_names(char **out,size_t max_out)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar1 = _DAT_003262f0;
  if (max_out != 0) {
    sVar2 = 7;
    if (max_out < 7) {
      sVar2 = max_out;
    }
    lVar3 = sVar2 - 1;
    auVar6._8_4_ = (int)lVar3;
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
    pcVar4 = "P-256";
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_003262f0;
    auVar7 = _DAT_003262e0;
    do {
      auVar8 = auVar7 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(char **)((long)out + uVar5) = pcVar4 + -0x48;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(char **)((long)out + uVar5 + 8) = pcVar4;
      }
      lVar3 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar3 + 2;
      uVar5 = uVar5 + 0x10;
      pcVar4 = pcVar4 + 0x90;
    } while (((int)sVar2 * 8 + 8U & 0x70) != uVar5);
  }
  return 7;
}

Assistant:

inline size_t GetAllNames(const char **out, size_t max_out,
                          Span<const char *const> fixed_names, Name(T::*name),
                          Span<const T> objects) {
  auto span = bssl::Span(out, max_out);
  for (size_t i = 0; !span.empty() && i < fixed_names.size(); i++) {
    span[0] = fixed_names[i];
    span = span.subspan(1);
  }
  span = span.subspan(0, objects.size());
  for (size_t i = 0; i < span.size(); i++) {
    span[i] = objects[i].*name;
  }
  return fixed_names.size() + objects.size();
}